

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall httplib::Request::is_multipart_form_data(Request *this)

{
  long lVar1;
  string sStack_28;
  
  get_header_value_abi_cxx11_(&sStack_28,this,"Content-Type",0);
  lVar1 = std::__cxx11::string::rfind((char *)&sStack_28,0x147f3e);
  std::__cxx11::string::~string((string *)&sStack_28);
  return lVar1 == 0;
}

Assistant:

inline bool Request::is_multipart_form_data() const {
  const auto &content_type = get_header_value("Content-Type");
  return !content_type.rfind("multipart/form-data", 0);
}